

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Value __thiscall Catch::RunContext::actOnCurrentResult(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  Value VVar2;
  uint uVar3;
  
  AssertionResult::operator=(&this->m_lastResult,result);
  (*(this->super_IResultCapture)._vptr_IResultCapture[2])(this,&this->m_lastResult);
  VVar2 = None;
  if ((((this->m_lastResult).m_resultData.resultType & FailureBit) != Ok) &&
     (((this->m_lastResult).m_info.resultDisposition & SuppressFail) == Normal)) {
    uVar3 = (*(this->super_IResultCapture)._vptr_IResultCapture[7])(this);
    bVar1 = aborting(this);
    VVar2 = (uVar3 & 0xff) * 2 + (uint)bVar1 * 4 + Failed;
  }
  return VVar2;
}

Assistant:

ResultAction::Value actOnCurrentResult( AssertionResult const& result ) {
            m_lastResult = result;
            assertionEnded( m_lastResult );

            ResultAction::Value action = ResultAction::None;

            if( !m_lastResult.isOk() ) {
                action = ResultAction::Failed;
                if( shouldDebugBreak() )
                    action = (ResultAction::Value)( action | ResultAction::Debug );
                if( aborting() )
                    action = (ResultAction::Value)( action | ResultAction::Abort );
            }
            return action;
        }